

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex3::Run(UnitTest_lex3 *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  allocator local_181;
  string local_180;
  LexerWrapper lexer;
  
  std::__cxx11::string::string
            ((string *)&local_180,
             "[==[long\nlong\nstring]==]\'string\'\"string\"[=[incomplete string]=",&local_181);
  anon_unknown.dwarf_3b64::LexerWrapper::LexerWrapper(&lexer,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
    if (iVar1 != 0x116) {
      std::__cxx11::string::string
                ((string *)&local_180,"\'lexer.GetToken() == luna::Token_String\'",&local_181);
      UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
    }
  }
  anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&lexer);
  std::__cxx11::string::string
            ((string *)&local_180,"\'{ lexer.GetToken(); }\' has no luna::LexException",&local_181);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  anon_unknown.dwarf_3b64::LexerWrapper::~LexerWrapper(&lexer);
  return;
}

Assistant:

TEST_CASE(lex3)
{
    LexerWrapper lexer("[==[long\nlong\nstring]==]'string'\"string\""
                       "[=[incomplete string]=");
    for (int i = 0; i < 3; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_String);

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}